

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.c
# Opt level: O0

_Bool hashmap_iter(hashmap *map,size_t *i,void **item)

{
  bucket *entry;
  void *pvVar1;
  bucket *bucket;
  void **item_local;
  size_t *i_local;
  hashmap *map_local;
  
  do {
    if (map->nbuckets <= *i) {
      return false;
    }
    entry = bucket_at(map,*i);
    *i = *i + 1;
  } while ((ulong)*entry >> 0x30 == 0);
  pvVar1 = bucket_item(entry);
  *item = pvVar1;
  return true;
}

Assistant:

bool hashmap_iter(struct hashmap *map, size_t *i, void **item) {
    struct bucket *bucket;
    do {
        if (*i >= map->nbuckets) return false;
        bucket = bucket_at(map, *i);
        (*i)++;
    } while (!bucket->dib);
    *item = bucket_item(bucket);
    return true;
}